

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::files_checked(torrent *this)

{
  int *piVar1;
  byte bVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  ulong uVar3;
  pointer pppVar4;
  peer_connection *this_00;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 in_RDX;
  peer_connection *ctx;
  pointer pppVar7;
  _List_node_base *p_Var8;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_38;
  
  if (((this->super_torrent_hot_members).field_0x4b & 4) != 0) {
    UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
    (*UNRECOVERED_JUMPTABLE)(this,"files_checked(), paused",in_RDX,UNRECOVERED_JUMPTABLE);
    return;
  }
  if ((this->field_0x600 & 1) != 0) {
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c])
              ();
  }
  bVar5 = is_seed(this);
  if (bVar5) {
    this->field_0x606 = this->field_0x606 | 0x40;
    tracker_list::set_complete_sent(&this->m_trackers);
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xc00000000000000) ==
        0x800000000000000) goto LAB_00312ae0;
  }
  else {
    if ((this->field_0x5cc & 8) != 0) {
      this->field_0x5cc = this->field_0x5cc & 0xf7;
      bVar2 = (this->m_need_save_resume_data).m_val;
      if ((bVar2 & 0x40) == 0) {
        (this->m_need_save_resume_data).m_val = bVar2 | 0x40;
        state_updated(this);
      }
      state_updated(this);
    }
    if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xe00000000000000) ==
         0x800000000000000) || (bVar5 = is_finished(this), !bVar5)) goto LAB_00312ae0;
  }
  finished(this);
LAB_00312ae0:
  if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xc00000000000000) !=
       0x800000000000000) && ((this->field_0x5cc & 4) == 0)) {
    set_state(this,downloading);
  }
  iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  if ((*(uint *)(CONCAT44(extraout_var,iVar6) + 0x68) & 0x40) != 0) {
    iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)&stack0xffffffffffffffc0);
    alert_manager::emplace_alert<libtorrent::torrent_checked_alert,libtorrent::torrent_handle>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar6),
               (torrent_handle *)&stack0xffffffffffffffc0);
    if ((_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)local_38._M_head_impl !=
        (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)&((local_38._M_head_impl)->m_piece_map).
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                .
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        iVar6 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar6 = *(int *)((long)&((local_38._M_head_impl)->m_piece_map).
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                .
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        *(int *)((long)&((local_38._M_head_impl)->m_piece_map).
                        super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        .
                        super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar6 + -1;
      }
      if (iVar6 == 1) {
        (*(code *)((local_38._M_head_impl)->m_piece_map).
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  .
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start[3])();
      }
    }
  }
  for (p_Var8 = (this->m_extensions).
                super__List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var8 != (_List_node_base *)&this->m_extensions; p_Var8 = p_Var8->_M_next) {
    (**(code **)((long)(p_Var8[1]._M_next)->_M_next + 0x40))();
  }
  uVar3 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  *(ulong *)&(this->super_torrent_hot_members).field_0x48 = uVar3 | 0x2000000;
  this->field_0x5c0 = this->field_0x5c0 | 8;
  bVar5 = want_tick(this);
  ctx = (peer_connection *)0x1;
  update_list(this,(torrent_list_index_t)0x1,bVar5);
  pppVar7 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pppVar4 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pppVar7 == pppVar4) {
      start_announcing(this);
      maybe_connect_web_seeds(this);
      return;
    }
    this_00 = *pppVar7;
    if (((uint)uVar3 >> 0x19 & 1) == 0) {
      iVar6 = (*(this_00->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this_00);
      if ((char)iVar6 == '\0') {
        peer_connection::on_metadata_impl(this_00);
        iVar6 = (*(this_00->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this_00);
        if ((char)iVar6 == '\0') {
          peer_connection::init(this_00,(EVP_PKEY_CTX *)ctx);
          goto LAB_00312c0d;
        }
      }
    }
    else {
LAB_00312c0d:
      ctx = (peer_connection *)0x4;
      peer_connection::peer_log(this_00,info,"ON_FILES_CHECKED");
      if (((((this_00->super_peer_connection_hot_members).field_0x28 & 0x10) != 0) &&
          (-1 < *(short *)&this_00->field_0x885)) &&
         (ctx = this_00, bVar5 = request_a_block(this,this_00), bVar5)) {
        iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x4b])();
        ctx = (peer_connection *)0x1c;
        counters::inc_stats_counter((counters *)CONCAT44(extraout_var_01,iVar6),0x1c,1);
        peer_connection::send_block_requests(this_00);
      }
    }
    pppVar7 = pppVar7 + 1;
  } while( true );
}

Assistant:

void torrent::files_checked()
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(m_torrent_file->is_valid());

		if (m_abort)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("files_checked(), paused");
#endif
			return;
		}

		// calling pause will also trigger the auto managed
		// recalculation
		// if we just got here by downloading the metadata,
		// just keep going, no need to disconnect all peers just
		// to restart the torrent in a second
		if (m_auto_managed)
		{
			// if this is an auto managed torrent, force a recalculation
			// of which torrents to have active
			m_ses.trigger_auto_manage();
		}

		if (!is_seed())
		{
#ifndef TORRENT_DISABLE_SUPERSEEDING
			// turn off super seeding if we're not a seed
			if (m_super_seeding)
			{
				m_super_seeding = false;
				set_need_save_resume(torrent_handle::if_state_changed);
				state_updated();
			}
#endif

			if (m_state != torrent_status::finished && is_finished())
				finished();
		}
		else
		{
			// we just added this torrent as a seed, or force-rechecked it, and we
			// have all of it. Assume that we sent the event=completed when we
			// finished downloading it, and don't send any more.
			m_complete_sent = true;
			m_trackers.set_complete_sent();

			if (m_state != torrent_status::finished
				&& m_state != torrent_status::seeding)
				finished();
		}

		// we might be finished already, in which case we should
		// not switch to downloading mode. If all files are
		// filtered, we're finished when we start.
		if (m_state != torrent_status::finished
			&& m_state != torrent_status::seeding
			&& !m_seed_mode)
		{
			set_state(torrent_status::downloading);
		}

		INVARIANT_CHECK;

		if (m_ses.alerts().should_post<torrent_checked_alert>())
		{
			m_ses.alerts().emplace_alert<torrent_checked_alert>(
				get_handle());
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			ext->on_files_checked();
		}
#endif

		bool const notify_initialized = !m_connections_initialized;
		m_connections_initialized = true;
		m_files_checked = true;

		update_want_tick();

		for (auto* pc : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			// all peer connections have to initialize themselves now that the metadata
			// is available
			if (notify_initialized)
			{
				if (pc->is_disconnecting()) continue;
				pc->on_metadata_impl();
				if (pc->is_disconnecting()) continue;
				pc->init();
			}

#ifndef TORRENT_DISABLE_LOGGING
			pc->peer_log(peer_log_alert::info, "ON_FILES_CHECKED");
#endif
			if (pc->is_interesting() && !pc->has_peer_choked())
			{
				if (request_a_block(*this, *pc))
				{
					inc_stats_counter(counters::unchoke_piece_picks);
					pc->send_block_requests();
				}
			}
		}

		start_announcing();

		maybe_connect_web_seeds();
	}